

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lbaselib.cpp
# Opt level: O2

int luaopen_base(lua_State *L)

{
  lua_pushvalue(L,-0x2712);
  lua_setfield(L,-0x2712,"_G");
  luaL_register(L,"_G",base_funcs);
  lua_pushlstring(L,"Lua 5.1",7);
  lua_setfield(L,-0x2712,"_VERSION");
  auxopen(L,"ipairs",luaB_ipairs,ipairsaux);
  auxopen(L,"pairs",luaB_pairs,luaB_next);
  lua_createtable(L,0,1);
  lua_pushvalue(L,-1);
  lua_setmetatable(L,-2);
  lua_pushlstring(L,"kv",2);
  lua_setfield(L,-2,"__mode");
  lua_pushcclosure(L,luaB_newproxy,1);
  lua_setfield(L,-0x2712,"newproxy");
  luaL_register(L,"coroutine",co_funcs);
  return 2;
}

Assistant:

LUALIB_API int luaopen_base (lua_State *L) {
  base_open(L);
  luaL_register(L, LUA_COLIBNAME, co_funcs);
  return 2;
}